

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O1

bool CoreML::Specification::operator==(SupportVectorClassifier *a,SupportVectorClassifier *b)

{
  uint32 uVar1;
  SparseSupportVectors *pSVar2;
  DenseSupportVectors *pDVar3;
  StringVector *a_00;
  Int64Vector *a_01;
  bool bVar4;
  SparseSupportVectors *pSVar5;
  DenseSupportVectors *pDVar6;
  StringVector *b_00;
  Int64Vector *b_01;
  Kernel *b_02;
  Kernel *a_02;
  
  a_02 = a->kernel_;
  if (a_02 == (Kernel *)0x0) {
    a_02 = (Kernel *)&_Kernel_default_instance_;
  }
  b_02 = b->kernel_;
  if (b_02 == (Kernel *)0x0) {
    b_02 = (Kernel *)&_Kernel_default_instance_;
  }
  bVar4 = operator==(a_02,b_02);
  if (!bVar4) {
    return false;
  }
  bVar4 = operator==(&a->numberofsupportvectorsperclass_,&b->numberofsupportvectorsperclass_);
  if (!bVar4) {
    return false;
  }
  bVar4 = operator==(&a->coefficients_,&b->coefficients_);
  if (!bVar4) {
    return false;
  }
  bVar4 = operator==(&a->rho_,&b->rho_);
  if (!bVar4) {
    return false;
  }
  bVar4 = operator==(&a->proba_,&b->proba_);
  if (!bVar4) {
    return false;
  }
  bVar4 = operator==(&a->probb_,&b->probb_);
  if (!bVar4) {
    return false;
  }
  uVar1 = a->_oneof_case_[0];
  if (uVar1 != b->_oneof_case_[0]) {
    return false;
  }
  if (uVar1 == 4) {
    pDVar3 = (a->supportVectors_).densesupportvectors_;
    if (b->_oneof_case_[0] == 4) {
      pDVar6 = (b->supportVectors_).densesupportvectors_;
    }
    else {
      pDVar6 = DenseSupportVectors::default_instance();
    }
    bVar4 = operator==(&pDVar3->vectors_,&pDVar6->vectors_);
  }
  else {
    if (uVar1 != 3) goto LAB_002f6503;
    pSVar2 = (a->supportVectors_).sparsesupportvectors_;
    if (b->_oneof_case_[0] == 3) {
      pSVar5 = (b->supportVectors_).sparsesupportvectors_;
    }
    else {
      pSVar5 = SparseSupportVectors::default_instance();
    }
    bVar4 = operator==(&pSVar2->vectors_,&pSVar5->vectors_);
  }
  if (bVar4 == false) {
    return false;
  }
LAB_002f6503:
  uVar1 = a->_oneof_case_[1];
  if (uVar1 != b->_oneof_case_[1]) {
    return false;
  }
  if (uVar1 != 0) {
    if (uVar1 == 100) {
      a_00 = (a->ClassLabels_).stringclasslabels_;
      if (b->_oneof_case_[1] == 100) {
        b_00 = (b->ClassLabels_).stringclasslabels_;
      }
      else {
        b_00 = StringVector::default_instance();
      }
      bVar4 = vectorsEqual<CoreML::Specification::StringVector>(a_00,b_00);
      return bVar4;
    }
    a_01 = (a->ClassLabels_).int64classlabels_;
    if (b->_oneof_case_[1] == 0x65) {
      b_01 = (b->ClassLabels_).int64classlabels_;
    }
    else {
      b_01 = Int64Vector::default_instance();
    }
    bVar4 = vectorsEqual<CoreML::Specification::Int64Vector>(a_01,b_01);
    return bVar4;
  }
  return true;
}

Assistant:

bool operator==(const SupportVectorClassifier& a,
                        const SupportVectorClassifier& b) {
            if (a.kernel() != b.kernel()) {
                return false;
            }
            if (a.numberofsupportvectorsperclass() != b.numberofsupportvectorsperclass()) {
                return false;
            }
            if (a.coefficients() != b.coefficients()) {
                return false;
            }
            if (a.rho() != b.rho()) {
                return false;
            }
            if (a.proba() != b.proba()) {
                return false;
            }
            if (a.probb() != b.probb()) {
                return false;
            }
            if (a.supportVectors_case() != b.supportVectors_case()) {
                return false;
            }
            switch (a.supportVectors_case()) {
                case SupportVectorClassifier::kSparseSupportVectors:
                    if (a.sparsesupportvectors().vectors() != b.sparsesupportvectors().vectors()) {
                        return false;
                    }
                    break;
                case SupportVectorClassifier::kDenseSupportVectors:
                    if (a.densesupportvectors().vectors() != b.densesupportvectors().vectors()) {
                        return false;
                    }
                    break;
                case SupportVectorClassifier::SUPPORTVECTORS_NOT_SET:
                    break;
            }
            if (a.ClassLabels_case() != b.ClassLabels_case()) {
                return false;
            }
            switch (a.ClassLabels_case()) {
                case SupportVectorClassifier::kInt64ClassLabels:
                    return a.int64classlabels() == b.int64classlabels();
                case SupportVectorClassifier::kStringClassLabels:
                    return a.stringclasslabels() == b.stringclasslabels();
                case SupportVectorClassifier::CLASSLABELS_NOT_SET:
                    return true;
            }
        }